

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int relunitphrase(gdstate *gds)

{
  gdstate *gds_local;
  
  if (((gds->tokenp->token == 0x2d) && (gds->tokenp[1].token == 0x10b)) &&
     (gds->tokenp[2].token == 0x10a)) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelSeconds = gds->RelSeconds - gds->tokenp[1].value * gds->tokenp[2].value;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if (((gds->tokenp->token == 0x2b) && (gds->tokenp[1].token == 0x10b)) &&
          (gds->tokenp[2].token == 0x10a)) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelSeconds = gds->tokenp[1].value * gds->tokenp[2].value + gds->RelSeconds;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x10a)) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelSeconds = gds->tokenp->value * gds->tokenp[1].value + gds->RelSeconds;
    gds->tokenp = gds->tokenp + 2;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x2d) &&
          ((gds->tokenp[1].token == 0x10b && (gds->tokenp[2].token == 0x109)))) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelMonth = gds->RelMonth - gds->tokenp[1].value * gds->tokenp[2].value;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x2b) &&
          ((gds->tokenp[1].token == 0x10b && (gds->tokenp[2].token == 0x109)))) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelMonth = gds->tokenp[1].value * gds->tokenp[2].value + gds->RelMonth;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x109)) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelMonth = gds->tokenp->value * gds->tokenp[1].value + gds->RelMonth;
    gds->tokenp = gds->tokenp + 2;
    gds_local._4_4_ = 1;
  }
  else if (gds->tokenp->token == 0x10a) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelSeconds = gds->tokenp->value + gds->RelSeconds;
    gds->tokenp = gds->tokenp + 1;
    gds_local._4_4_ = 1;
  }
  else if (gds->tokenp->token == 0x109) {
    gds->HaveRel = gds->HaveRel + 1;
    gds->RelMonth = gds->tokenp->value + gds->RelMonth;
    gds->tokenp = gds->tokenp + 1;
    gds_local._4_4_ = 1;
  }
  else {
    gds_local._4_4_ = 0;
  }
  return gds_local._4_4_;
}

Assistant:

static int
relunitphrase(struct gdstate *gds)
{
	if (gds->tokenp[0].token == '-'
	    && gds->tokenp[1].token == tUNUMBER
	    && gds->tokenp[2].token == tSEC_UNIT) {
		/* "-3 hours" */
		gds->HaveRel++;
		gds->RelSeconds -= gds->tokenp[1].value * gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}
	if (gds->tokenp[0].token == '+'
	    && gds->tokenp[1].token == tUNUMBER
	    && gds->tokenp[2].token == tSEC_UNIT) {
		/* "+1 minute" */
		gds->HaveRel++;
		gds->RelSeconds += gds->tokenp[1].value * gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}
	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == tSEC_UNIT) {
		/* "1 day" */
		gds->HaveRel++;
		gds->RelSeconds += gds->tokenp[0].value * gds->tokenp[1].value;
		gds->tokenp += 2;
		return 1;
	}
	if (gds->tokenp[0].token == '-'
	    && gds->tokenp[1].token == tUNUMBER
	    && gds->tokenp[2].token == tMONTH_UNIT) {
		/* "-3 months" */
		gds->HaveRel++;
		gds->RelMonth -= gds->tokenp[1].value * gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}
	if (gds->tokenp[0].token == '+'
	    && gds->tokenp[1].token == tUNUMBER
	    && gds->tokenp[2].token == tMONTH_UNIT) {
		/* "+5 years" */
		gds->HaveRel++;
		gds->RelMonth += gds->tokenp[1].value * gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}
	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == tMONTH_UNIT) {
		/* "2 years" */
		gds->HaveRel++;
		gds->RelMonth += gds->tokenp[0].value * gds->tokenp[1].value;
		gds->tokenp += 2;
		return 1;
	}
	if (gds->tokenp[0].token == tSEC_UNIT) {
		/* "now", "tomorrow" */
		gds->HaveRel++;
		gds->RelSeconds += gds->tokenp[0].value;
		gds->tokenp += 1;
		return 1;
	}
	if (gds->tokenp[0].token == tMONTH_UNIT) {
		/* "month" */
		gds->HaveRel++;
		gds->RelMonth += gds->tokenp[0].value;
		gds->tokenp += 1;
		return 1;
	}
	return 0;
}